

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

MPP_RET vp8d_parser_reset(void *ctx)

{
  VP8DParserContext_t *p_00;
  VP8DParserContext_t *p;
  VP8DContext *c;
  MPP_RET ret;
  void *ctx_local;
  
  p_00 = *ctx;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x166,
               "vp8d_parser_reset");
  }
  vp8d_unref_allframe(p_00);
  p_00->needKeyFrame = 0;
  p_00->eos = 0;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x16a,
               "vp8d_parser_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8d_parser_reset(void *ctx)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;

    FUN_T("FUN_IN");
    vp8d_unref_allframe(p);
    p->needKeyFrame = 0;
    p->eos = 0;
    FUN_T("FUN_OUT");
    return ret;
}